

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::AutoFill
          (TPZMatrix<long_double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar8;
  longdouble in_ST4;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST5;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST6;
  longdouble lVar13;
  longdouble lVar14;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  longdouble sum;
  longdouble val;
  int64_t j;
  int64_t i;
  char *in_stack_00000128;
  char *in_stack_00000130;
  undefined8 uVar15;
  undefined2 uVar16;
  undefined8 in_stack_ffffffffffffff32;
  undefined8 local_88;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  longdouble local_78;
  undefined1 local_68 [16];
  longdouble local_58;
  undefined1 local_48 [24];
  long local_30;
  long local_28;
  int local_1c;
  
  local_1c = in_ECX;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,in_RSI,in_RDX);
  for (local_28 = 0; lVar1 = local_28, iVar5 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar5;
      local_28 = local_28 + 1) {
    local_58 = (longdouble)0;
    local_30 = 0;
    lVar7 = in_ST6;
    if (local_1c != 0) {
      for (; lVar2 = local_28, lVar1 = local_30, lVar7 = in_ST6, local_30 < local_28;
          local_30 = local_30 + 1) {
        in_ST0 = in_ST3;
        in_ST1 = in_ST4;
        in_ST3 = in_ST6;
        in_ST4 = in_ST6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        in_ST6 = in_ST4;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,local_68);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        std::fabs(__x);
        local_58 = local_58 + in_ST2;
        in_ST2 = in_ST5;
        in_ST5 = in_ST6;
      }
    }
    for (; lVar1 = local_30, iVar5 = TPZBaseMatrix::Cols(in_RDI), lVar1 < iVar5;
        local_30 = local_30 + 1) {
      GetRandomVal((TPZMatrix<long_double> *)
                   CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
      in_ST0 = in_ST1;
      lVar10 = in_ST2;
      lVar12 = in_ST3;
      lVar14 = in_ST4;
      lVar11 = in_ST5;
      lVar8 = in_ST6;
      if (local_28 != local_30) {
        in_ST0 = in_ST2;
        std::fabs(__x_00);
        local_58 = local_58 + in_ST1;
        lVar10 = in_ST3;
        lVar12 = in_ST4;
        lVar14 = in_ST5;
        lVar11 = in_ST6;
        lVar8 = lVar7;
      }
      in_ST6 = lVar7;
      in_ST5 = lVar8;
      in_ST4 = lVar11;
      in_ST3 = lVar14;
      in_ST2 = lVar12;
      in_ST1 = lVar10;
      lVar7 = in_ST6;
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,local_48);
      if (iVar4 == 0) {
        Error(in_stack_00000130,in_stack_00000128);
      }
    }
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    lVar7 = in_ST0;
    lVar10 = in_ST4;
    lVar12 = in_ST5;
    lVar14 = in_ST6;
    if (iVar5 == iVar6) {
      lVar7 = in_ST3;
      lVar8 = in_ST6;
      std::fabs(__x_01);
      lVar9 = lVar8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
      uVar15 = SUB108(in_ST1,0);
      uVar16 = (undefined2)((unkuint10)in_ST1 >> 0x40);
      std::fabs(__x_02);
      lVar11 = lVar9;
      if (in_ST2 < in_ST0) {
        local_78 = (longdouble)1 + local_58;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,local_28,local_28,&local_78,in_R8,in_R9,uVar15,uVar16);
      }
      lVar13 = lVar11;
      bVar3 = IsZero((longdouble)
                     CONCAT82(in_stack_ffffffffffffff32,(short)((unkuint10)local_58 >> 0x40)));
      in_ST1 = in_ST4;
      in_ST2 = in_ST5;
      in_ST3 = in_ST6;
      lVar10 = lVar8;
      lVar12 = lVar9;
      lVar14 = lVar11;
      if (bVar3) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        uVar15 = SUB108(lVar7,0);
        bVar3 = IsZero((longdouble)
                       CONCAT82(in_stack_ffffffffffffff32,(short)((unkuint10)lVar7 >> 0x40)));
        lVar7 = in_ST4;
        in_ST1 = in_ST5;
        in_ST2 = in_ST6;
        in_ST3 = lVar8;
        lVar10 = lVar9;
        lVar12 = lVar11;
        lVar14 = lVar13;
        if (bVar3) {
          local_88 = SUB108((longdouble)1,0);
          in_stack_ffffffffffffff80 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,local_28,local_28,&local_88,in_R8,in_R9,uVar15);
          lVar7 = in_ST4;
          in_ST1 = in_ST5;
          in_ST2 = in_ST6;
          in_ST3 = lVar8;
          lVar10 = lVar9;
          lVar12 = lVar11;
          lVar14 = lVar13;
        }
      }
    }
    in_ST0 = lVar7;
    in_ST4 = lVar10;
    in_ST5 = lVar12;
    in_ST6 = lVar14;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}